

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::Clear(TreeEnsembleParameters_TreeNode *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>::TypeHandler>
            (&(this->evaluationinfo_).super_RepeatedPtrFieldBase);
  this->falsechildnodeid_ = 0;
  this->relativehitrate_ = 0.0;
  this->branchfeaturevalue_ = 0.0;
  this->truechildnodeid_ = 0;
  this->nodebehavior_ = 0;
  this->missingvaluetrackstruechild_ = false;
  *(undefined3 *)&this->field_0x3d = 0;
  this->branchfeatureindex_ = 0;
  this->treeid_ = 0;
  this->nodeid_ = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  evaluationinfo_.Clear();
  ::memset(&treeid_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&relativehitrate_) -
      reinterpret_cast<char*>(&treeid_)) + sizeof(relativehitrate_));
  _internal_metadata_.Clear<std::string>();
}